

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall Client::Client(Client *this,Socket *sock,Server *server)

{
  undefined8 uVar1;
  in_port_t iVar2;
  in_addr iVar3;
  impl_ *piVar4;
  time_t tVar5;
  
  this->_vptr_Client = (_func_int **)&PTR_NeedTick_001d3ba8;
  piVar4 = (impl_ *)operator_new(0x14);
  piVar4->sock = sock->sock;
  iVar2 = (sock->sin).sin_port;
  iVar3.s_addr = (sock->sin).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(sock->sin).sin_zero;
  (piVar4->sin).sin_family = (sock->sin).sin_family;
  (piVar4->sin).sin_port = iVar2;
  (piVar4->sin).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(piVar4->sin).sin_zero = uVar1;
  (this->impl)._M_t.super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
  super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
  super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl = piVar4;
  this->server = server;
  this->connected = true;
  this->finished_writing = false;
  this->accepted = false;
  tVar5 = time((time_t *)0x0);
  this->connect_time = tVar5;
  (this->recv_buffer)._M_dataplus._M_p = (pointer)&(this->recv_buffer).field_2;
  (this->recv_buffer)._M_string_length = 0;
  (this->recv_buffer).field_2._M_local_buf[0] = '\0';
  this->recv_buffer_gpos = 0;
  this->recv_buffer_ppos = 0;
  this->recv_buffer_used = 0;
  (this->send_buffer)._M_dataplus._M_p = (pointer)&(this->send_buffer).field_2;
  (this->send_buffer)._M_string_length = 0;
  (this->send_buffer).field_2._M_local_buf[0] = '\0';
  this->send_buffer_gpos = 0;
  this->send_buffer_ppos = 0;
  this->send_buffer_used = 0;
  return;
}

Assistant:

Client::Client(const Socket &sock, Server *server)
	: impl(new impl_(sock.sock, sock.sin))
	, server(server)
	, connected(true)
	, connect_time(std::time(0))
	, recv_buffer_gpos(0)
	, recv_buffer_ppos(0)
	, recv_buffer_used(0)
	, send_buffer_gpos(0)
	, send_buffer_ppos(0)
	, send_buffer_used(0)
{ }